

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

Response execute_command(PingCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  Task *in_RDX;
  json_value extraout_RDX;
  TaskSpec *in_RDI;
  Response RVar1;
  string *in_stack_00000088;
  string local_40 [64];
  
  Task::spec(in_RDX);
  TaskSpec::hex_conn_id_abi_cxx11_(in_RDI);
  Response::ping(in_stack_00000088);
  std::__cxx11::string::~string(local_40);
  RVar1.content.m_value.object = extraout_RDX.object;
  RVar1.content._0_8_ = in_RDI;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command([[maybe_unused]] const PingCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    return Response::ping(task->spec().hex_conn_id());
}